

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O2

QRect __thiscall QFbCursor::drawCursor(QFbCursor *this,QPainter *painter)

{
  QRect *this_00;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  QRect local_40;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x10] == (QFbCursor)0x1) {
    this[0x40] = (QFbCursor)0x0;
    this_00 = (QRect *)(this + 0x20);
    bVar1 = QRect::isNull(this_00);
    if (!bVar1) {
      local_30 = (QPoint)(**(code **)(**(long **)(this + 0x18) + 0x68))();
      local_40 = QRect::translated(this_00,&local_30);
      (**(code **)(**(long **)(this + 0x18) + 0x68))();
      cVar2 = QRect::intersects(&local_40);
      if (cVar2 != '\0') {
        *(undefined8 *)(this + 0x30) = *(undefined8 *)this_00;
        *(undefined8 *)(this + 0x38) = *(undefined8 *)(this + 0x28);
        QPainter::drawImage(painter,(QRect *)(this + 0x30),*(QImage **)(this + 0x48));
        this[0x41] = (QFbCursor)0x1;
        uVar5 = *(undefined8 *)(this + 0x38);
        uVar3 = *(ulong *)(this + 0x30) & 0xffffffff00000000;
        uVar4 = *(ulong *)(this + 0x30) & 0xffffffff;
        goto LAB_001127ed;
      }
    }
  }
  uVar5 = 0xffffffffffffffff;
  uVar4 = 0;
  uVar3 = 0;
LAB_001127ed:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  QVar6._0_8_ = uVar3 | uVar4;
  QVar6.x2.m_i = (int)uVar5;
  QVar6.y2.m_i = (int)((ulong)uVar5 >> 0x20);
  return QVar6;
}

Assistant:

QRect QFbCursor::drawCursor(QPainter & painter)
{
    if (!mVisible)
        return QRect();

    mDirty = false;
    if (mCurrentRect.isNull())
        return QRect();

    // We need this because the cursor might be mDirty due to moving off mScreen
    QPoint mScreenOffset = mScreen->geometry().topLeft();
    // global to local translation
    if (!mCurrentRect.translated(mScreenOffset).intersects(mScreen->geometry()))
        return QRect();

    mPrevRect = mCurrentRect;
    painter.drawImage(mPrevRect, *mCursorImage->image());
    mOnScreen = true;
    return mPrevRect;
}